

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O1

Function * __thiscall Function::setVerbose(Function *this,bool verbose,ostream *log)

{
  bool bVar1;
  Function *unaff_R12;
  
  bVar1 = false;
  while( true ) {
    this->bVerbose = verbose;
    this->oLog = log;
    if (this->xRight != (Function *)0x0) {
      setVerbose(this->xRight,verbose,log);
    }
    if (this->xLeft != (Function *)0x0) {
      setVerbose(this->xLeft,verbose,log);
    }
    if (this->xPlus == (Function *)0x0) break;
    if (!bVar1) {
      unaff_R12 = this;
    }
    bVar1 = true;
    this = this->xPlus;
  }
  if (bVar1) {
    this = unaff_R12;
  }
  return this;
}

Assistant:

Function &Function::setVerbose(bool verbose, ostream *log)
{
		bVerbose = verbose;
		oLog = log;
		if (xRight) xRight->setVerbose(verbose, log);
		if (xLeft) xLeft->setVerbose(verbose, log);
		if (xPlus) xPlus->setVerbose(verbose, log);
		return *this;
}